

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# b64.c
# Opt level: O3

bool_t b64IsValid(char *b64)

{
  byte bVar1;
  bool_t bVar2;
  size_t sVar3;
  uint uVar4;
  size_t sVar5;
  
  bVar2 = strIsValid(b64);
  if (bVar2 == 0) {
    return 0;
  }
  sVar3 = strLen(b64);
  if ((sVar3 & 3) != 0) {
    return 0;
  }
  if (sVar3 == 0) {
    return 1;
  }
  if (b64[sVar3 - 1] == '=') {
    sVar3 = sVar3 + ~(ulong)(b64[sVar3 - 2] == '=');
  }
  uVar4 = (uint)sVar3 & 3;
  if (uVar4 == 2) {
    bVar1 = b64_dec_table[(byte)b64[sVar3 - 1]] & 0xf;
  }
  else {
    if (uVar4 != 3) goto LAB_001104a0;
    bVar1 = b64_dec_table[(byte)b64[sVar3 - 1]] & 3;
  }
  if (bVar1 != 0) {
    return 0;
  }
  sVar3 = sVar3 - 1;
LAB_001104a0:
  if (sVar3 != 0) {
    sVar5 = 0;
    do {
      if (b64_dec_table[(byte)b64[sVar5]] == 0xff) {
        return 0;
      }
      sVar5 = sVar5 + 1;
    } while (sVar3 != sVar5);
  }
  return 1;
}

Assistant:

bool_t b64IsValid(const char* b64)
{
	size_t len;
	if (!strIsValid(b64))
		return FALSE;
	// проверить длину
	len = strLen(b64);
	if (len % 4)
		return FALSE;
	// обработать паддинг 
	if (len && b64[len - 1] == '=' && b64[--len - 1] == '=')
		--len;
	// последний блок данных из 2 октетов?
	if (len % 4 == 3)
	{
		if (b64_dec_table[(octet)b64[len - 1]] & 3)
			return FALSE;
		--len;
	}
	// последний блок данных из 1 октета?
	else if (len % 4 == 2)
	{
		if (b64_dec_table[(octet)b64[len - 1]] & 15)
			return FALSE;
		--len;
	}
	// проверить остальные символы 
	for (; len--; ++b64)
		if (b64_dec_table[(octet)*b64] == 0xFF)
			return FALSE;
	return TRUE;
}